

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bgzf.c
# Opt level: O1

BGZF * bgzf_read_init(hFILE *hfpr)

{
  uint uVar1;
  ssize_t sVar2;
  BGZF *pBVar3;
  void *pvVar4;
  uint uVar5;
  uint uVar6;
  uint uVar7;
  uint8_t magic [18];
  char local_48;
  char local_47;
  byte local_45;
  int local_3c;
  
  sVar2 = hpeek(hfpr,&local_48,0x12);
  if (-1 < sVar2) {
    pBVar3 = (BGZF *)calloc(1,0x60);
    uVar7 = 0;
    if (pBVar3 != (BGZF *)0x0) {
      uVar1 = *(uint *)pBVar3;
      uVar6 = (uint)(local_47 == -0x75) << 0x1d;
      if (local_48 != '\x1f') {
        uVar6 = uVar7;
      }
      uVar5 = 0;
      if (sVar2 == 2) {
        uVar5 = uVar6;
      }
      *(uint *)pBVar3 = uVar1 & 0xfffcffff;
      *(uint *)pBVar3 = uVar5 | uVar1 & 0x9ffcffff;
      pvVar4 = malloc(0x10000);
      pBVar3->uncompressed_block = pvVar4;
      pvVar4 = malloc(0x10000);
      if (sVar2 != 0x12) {
        uVar6 = 0;
      }
      pBVar3->compressed_block = pvVar4;
      *(uint *)pBVar3 = uVar1 & 0x9ffcffff | uVar6;
      if ((uVar6 != 0) && (uVar7 = 0x80000000, (local_45 & 4) != 0)) {
        uVar7 = (uint)(local_3c != 0x24342) << 0x1f;
      }
      *(uint *)pBVar3 = uVar1 & 0x1ffcffff | uVar6 | uVar7;
      pvVar4 = calloc(1,0x28);
      pBVar3->cache = pvVar4;
      return pBVar3;
    }
  }
  return (BGZF *)0x0;
}

Assistant:

static BGZF *bgzf_read_init(hFILE *hfpr)
{
    BGZF *fp;
    uint8_t magic[18];
    ssize_t n = hpeek(hfpr, magic, 18);
    if (n < 0) return NULL;

    fp = (BGZF*)calloc(1, sizeof(BGZF));
    if (fp == NULL) return NULL;

    fp->is_write = 0;
    fp->is_compressed = (n==2 && magic[0]==0x1f && magic[1]==0x8b);
    fp->uncompressed_block = malloc(BGZF_MAX_BLOCK_SIZE);
    fp->compressed_block = malloc(BGZF_MAX_BLOCK_SIZE);
    fp->is_compressed = (n==18 && magic[0]==0x1f && magic[1]==0x8b) ? 1 : 0;
    fp->is_gzip = ( !fp->is_compressed || ((magic[3]&4) && memcmp(&magic[12], "BC\2\0",4)==0) ) ? 0 : 1;
#ifdef BGZF_CACHE
    fp->cache = kh_init(cache);
#endif
    return fp;
}